

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pageant.c
# Opt level: O2

void key_list_callback(void *ctx,char **fingerprints,char *comment,uint32_t ext_flags,
                      pageant_pubkey *key)

{
  FingerprintType FVar1;
  char *pcVar2;
  char *pcVar3;
  
  pcVar2 = " (re-encryptable)";
  if ((ext_flags & 1) == 0) {
    pcVar2 = "";
  }
  pcVar3 = " (encrypted)";
  if ((ext_flags & 2) == 0) {
    pcVar3 = pcVar2;
  }
  FVar1 = ssh2_pick_fingerprint(fingerprints,key_list_fptype ^ SSH_FPTYPE_SHA256);
  printf("%s %s%s\n",fingerprints[FVar1],comment,pcVar3);
  return;
}

Assistant:

void key_list_callback(void *ctx, char **fingerprints, const char *comment,
                       uint32_t ext_flags, struct pageant_pubkey *key)
{
    const char *mode = "";
    if (ext_flags & LIST_EXTENDED_FLAG_HAS_NO_CLEARTEXT_KEY)
        mode = " (encrypted)";
    else if (ext_flags & LIST_EXTENDED_FLAG_HAS_ENCRYPTED_KEY_FILE)
        mode = " (re-encryptable)";

    FingerprintType this_type =
        ssh2_pick_fingerprint(fingerprints, key_list_fptype);
    printf("%s %s%s\n", fingerprints[this_type], comment, mode);
}